

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

bool embree::avx::OrientedDiscMiIntersectorK<4,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  uint uVar9;
  Scene *pSVar10;
  Geometry *pGVar11;
  __int_type_conflict _Var12;
  RTCFilterFunctionN p_Var13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  RTCFilterFunctionNArguments local_168;
  undefined1 local_138 [16];
  undefined1 local_128 [32];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  RTCHitN local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint uStack_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  pSVar10 = context->scene;
  uVar28 = (ulong)(Disc->primIDs).field_0.i[0];
  pGVar11 = (pSVar10->geometries).items[Disc->sharedGeomID].ptr;
  lVar29 = *(long *)&pGVar11->field_0x58;
  _Var12 = pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar32 = *(undefined1 (*) [16])(lVar29 + _Var12 * uVar28);
  uVar27 = (ulong)(Disc->primIDs).field_0.i[1];
  auVar35 = *(undefined1 (*) [16])(lVar29 + _Var12 * uVar27);
  uVar25 = (ulong)(Disc->primIDs).field_0.i[2];
  auVar31 = *(undefined1 (*) [16])(lVar29 + _Var12 * uVar25);
  uVar26 = (ulong)(Disc->primIDs).field_0.i[3];
  auVar34 = *(undefined1 (*) [16])(lVar29 + _Var12 * uVar26);
  auVar40 = vunpcklps_avx(auVar32,auVar31);
  auVar36 = vunpckhps_avx(auVar32,auVar31);
  auVar32 = vunpcklps_avx(auVar35,auVar34);
  auVar37 = vunpckhps_avx(auVar35,auVar34);
  auVar18 = vunpcklps_avx(auVar40,auVar32);
  local_178 = vunpckhps_avx(auVar40,auVar32);
  local_188 = vunpcklps_avx(auVar36,auVar37);
  lVar29 = *(long *)&pGVar11[1].time_range.upper;
  p_Var13 = pGVar11[1].intersectionFilterN;
  auVar32 = *(undefined1 (*) [16])(lVar29 + uVar28 * (long)p_Var13);
  auVar35 = *(undefined1 (*) [16])(lVar29 + uVar27 * (long)p_Var13);
  auVar31 = *(undefined1 (*) [16])(lVar29 + uVar25 * (long)p_Var13);
  auVar34 = *(undefined1 (*) [16])(lVar29 + (long)p_Var13 * uVar26);
  auVar40 = vunpcklps_avx(auVar32,auVar31);
  auVar32 = vunpckhps_avx(auVar32,auVar31);
  auVar31 = vunpcklps_avx(auVar35,auVar34);
  auVar35 = vunpckhps_avx(auVar35,auVar34);
  local_d8 = vunpcklps_avx(auVar32,auVar35);
  local_f8 = vunpcklps_avx(auVar40,auVar31);
  local_e8 = vunpckhps_avx(auVar40,auVar31);
  local_138 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  fVar1 = *(float *)(ray + k * 4 + 0x10);
  auVar40._4_4_ = fVar1;
  auVar40._0_4_ = fVar1;
  auVar40._8_4_ = fVar1;
  auVar40._12_4_ = fVar1;
  fVar2 = *(float *)(ray + k * 4 + 0x20);
  auVar43._4_4_ = fVar2;
  auVar43._0_4_ = fVar2;
  auVar43._8_4_ = fVar2;
  auVar43._12_4_ = fVar2;
  fVar3 = *(float *)(ray + k * 4 + 0x40);
  fVar4 = *(float *)(ray + k * 4 + 0x50);
  fVar5 = *(float *)(ray + k * 4 + 0x60);
  auVar32._0_4_ = fVar3 * local_f8._0_4_ + fVar4 * local_e8._0_4_ + fVar5 * local_d8._0_4_;
  auVar32._4_4_ = fVar3 * local_f8._4_4_ + fVar4 * local_e8._4_4_ + fVar5 * local_d8._4_4_;
  auVar32._8_4_ = fVar3 * local_f8._8_4_ + fVar4 * local_e8._8_4_ + fVar5 * local_d8._8_4_;
  auVar32._12_4_ = fVar3 * local_f8._12_4_ + fVar4 * local_e8._12_4_ + fVar5 * local_d8._12_4_;
  auVar35 = vcmpps_avx(ZEXT416(0) << 0x20,auVar32,4);
  auVar45._8_4_ = 0x3f800000;
  auVar45._0_8_ = &DAT_3f8000003f800000;
  auVar45._12_4_ = 0x3f800000;
  auVar32 = vblendvps_avx(auVar45,auVar32,auVar35);
  auVar31 = vsubps_avx(local_188,auVar43);
  auVar34 = vsubps_avx(local_178,auVar40);
  fVar6 = *(float *)(ray + k * 4);
  auVar47._4_4_ = fVar6;
  auVar47._0_4_ = fVar6;
  auVar47._8_4_ = fVar6;
  auVar47._12_4_ = fVar6;
  auVar40 = vsubps_avx(auVar18,auVar47);
  auVar33._0_4_ =
       auVar34._0_4_ * local_e8._0_4_ + auVar31._0_4_ * local_d8._0_4_ +
       local_f8._0_4_ * auVar40._0_4_;
  auVar33._4_4_ =
       auVar34._4_4_ * local_e8._4_4_ + auVar31._4_4_ * local_d8._4_4_ +
       local_f8._4_4_ * auVar40._4_4_;
  auVar33._8_4_ =
       auVar34._8_4_ * local_e8._8_4_ + auVar31._8_4_ * local_d8._8_4_ +
       local_f8._8_4_ * auVar40._8_4_;
  auVar33._12_4_ =
       auVar34._12_4_ * local_e8._12_4_ + auVar31._12_4_ * local_d8._12_4_ +
       local_f8._12_4_ * auVar40._12_4_;
  local_108 = vdivps_avx(auVar33,auVar32);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar31._4_4_ = uVar7;
  auVar31._0_4_ = uVar7;
  auVar31._8_4_ = uVar7;
  auVar31._12_4_ = uVar7;
  auVar32 = vcmpps_avx(auVar31,local_108,2);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar34._4_4_ = uVar7;
  auVar34._0_4_ = uVar7;
  auVar34._8_4_ = uVar7;
  auVar34._12_4_ = uVar7;
  auVar31 = vcmpps_avx(local_108,auVar34,2);
  auVar32 = vandps_avx(auVar31,auVar32);
  auVar31 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar31 = vpcmpgtd_avx(auVar31,_DAT_01ff0cf0);
  auVar32 = vandps_avx(auVar32,auVar31);
  auVar31 = auVar35 & auVar32;
  if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar31 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar31 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar31[0xf] < '\0') {
    auVar32 = vandps_avx(auVar35,auVar32);
    auVar40 = vunpckhps_avx(auVar36,auVar37);
    fVar14 = local_108._0_4_;
    fVar15 = local_108._4_4_;
    fVar16 = local_108._8_4_;
    fVar17 = local_108._12_4_;
    auVar37._0_4_ = fVar6 + fVar3 * fVar14;
    auVar37._4_4_ = fVar6 + fVar3 * fVar15;
    auVar37._8_4_ = fVar6 + fVar3 * fVar16;
    auVar37._12_4_ = fVar6 + fVar3 * fVar17;
    auVar38._0_4_ = fVar1 + fVar4 * fVar14;
    auVar38._4_4_ = fVar1 + fVar4 * fVar15;
    auVar38._8_4_ = fVar1 + fVar4 * fVar16;
    auVar38._12_4_ = fVar1 + fVar4 * fVar17;
    auVar41._0_4_ = fVar2 + fVar5 * fVar14;
    auVar41._4_4_ = fVar2 + fVar5 * fVar15;
    auVar41._8_4_ = fVar2 + fVar5 * fVar16;
    auVar41._12_4_ = fVar2 + fVar5 * fVar17;
    auVar35 = vsubps_avx(auVar37,auVar18);
    auVar31 = vsubps_avx(auVar38,local_178);
    auVar34 = vsubps_avx(auVar41,local_188);
    auVar36._0_4_ =
         auVar35._0_4_ * auVar35._0_4_ +
         auVar31._0_4_ * auVar31._0_4_ + auVar34._0_4_ * auVar34._0_4_;
    auVar36._4_4_ =
         auVar35._4_4_ * auVar35._4_4_ +
         auVar31._4_4_ * auVar31._4_4_ + auVar34._4_4_ * auVar34._4_4_;
    auVar36._8_4_ =
         auVar35._8_4_ * auVar35._8_4_ +
         auVar31._8_4_ * auVar31._8_4_ + auVar34._8_4_ * auVar34._8_4_;
    auVar36._12_4_ =
         auVar35._12_4_ * auVar35._12_4_ +
         auVar31._12_4_ * auVar31._12_4_ + auVar34._12_4_ * auVar34._12_4_;
    auVar35._0_4_ = auVar40._0_4_ * auVar40._0_4_;
    auVar35._4_4_ = auVar40._4_4_ * auVar40._4_4_;
    auVar35._8_4_ = auVar40._8_4_ * auVar40._8_4_;
    auVar35._12_4_ = auVar40._12_4_ * auVar40._12_4_;
    auVar35 = vcmpps_avx(auVar36,auVar35,1);
    auVar32 = vandps_avx(auVar35,auVar32);
    iVar24 = vmovmskps_avx(auVar32);
    if (iVar24 != 0) {
      auVar39 = ZEXT1264(ZEXT412(0)) << 0x20;
      local_128 = ZEXT1232(ZEXT412(0)) << 0x20;
      uVar28 = (ulong)(byte)iVar24;
      lVar29 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
      auVar42 = ZEXT464(0) << 0x20;
      auVar32 = vpcmpeqd_avx(auVar43,auVar43);
      auVar44 = ZEXT1664(auVar32);
      auVar46 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
      do {
        local_168.hit = local_c8;
        local_168.valid = (int *)&local_198;
        uVar25 = 0;
        if (uVar28 != 0) {
          for (; (uVar28 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
          }
        }
        uVar9 = *(uint *)(local_138 + uVar25 * 4);
        pGVar11 = (pSVar10->geometries).items[uVar9].ptr;
        if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          uVar28 = uVar28 ^ 1L << (uVar25 & 0x3f);
          bVar30 = true;
        }
        else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          bVar30 = false;
        }
        else {
          local_178._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
          uVar7 = *(undefined4 *)(local_128 + uVar25 * 4);
          local_98._4_4_ = uVar7;
          local_98._0_4_ = uVar7;
          local_98._8_4_ = uVar7;
          local_98._12_4_ = uVar7;
          uVar7 = *(undefined4 *)(local_128 + uVar25 * 4 + 0x10);
          local_88._4_4_ = uVar7;
          local_88._0_4_ = uVar7;
          local_88._8_4_ = uVar7;
          local_88._12_4_ = uVar7;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_108 + uVar25 * 4);
          local_168.context = context->user;
          local_68 = vpshufd_avx(ZEXT416(uVar9),0);
          uVar9 = (Disc->primIDs).field_0.i[uVar25];
          local_78._4_4_ = uVar9;
          local_78._0_4_ = uVar9;
          local_78._8_4_ = uVar9;
          local_78._12_4_ = uVar9;
          uVar7 = *(undefined4 *)(local_f8 + uVar25 * 4);
          uVar8 = *(undefined4 *)(local_e8 + uVar25 * 4);
          local_b8._4_4_ = uVar8;
          local_b8._0_4_ = uVar8;
          local_b8._8_4_ = uVar8;
          local_b8._12_4_ = uVar8;
          uVar8 = *(undefined4 *)(local_d8 + uVar25 * 4);
          local_a8._4_4_ = uVar8;
          local_a8._0_4_ = uVar8;
          local_a8._8_4_ = uVar8;
          local_a8._12_4_ = uVar8;
          local_c8[0] = (RTCHitN)(char)uVar7;
          local_c8[1] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_c8[2] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_c8[3] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          local_c8[4] = (RTCHitN)(char)uVar7;
          local_c8[5] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_c8[6] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_c8[7] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          local_c8[8] = (RTCHitN)(char)uVar7;
          local_c8[9] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_c8[10] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_c8[0xb] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          local_c8[0xc] = (RTCHitN)(char)uVar7;
          local_c8[0xd] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_c8[0xe] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_c8[0xf] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          vcmpps_avx(auVar39._0_32_,auVar39._0_32_,0xf);
          uStack_54 = (local_168.context)->instID[0];
          local_58 = uStack_54;
          uStack_50 = uStack_54;
          uStack_4c = uStack_54;
          uStack_48 = (local_168.context)->instPrimID[0];
          uStack_44 = uStack_48;
          uStack_40 = uStack_48;
          uStack_3c = uStack_48;
          local_198 = *(undefined8 *)(mm_lookupmask_ps + lVar29);
          uStack_190 = *(undefined8 *)(mm_lookupmask_ps + lVar29 + 8);
          local_168.geometryUserPtr = pGVar11->userPtr;
          local_168.N = 4;
          local_168.ray = (RTCRayN *)ray;
          if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            local_188._0_8_ = Disc;
            auVar32 = auVar44._0_16_;
            (*pGVar11->occlusionFilterN)(&local_168);
            auVar46 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
            auVar32 = vpcmpeqd_avx(auVar32,auVar32);
            auVar44 = ZEXT1664(auVar32);
            auVar42 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar39 = ZEXT1664(ZEXT816(0) << 0x40);
            Disc = (Primitive *)local_188._0_8_;
          }
          auVar18._8_8_ = uStack_190;
          auVar18._0_8_ = local_198;
          auVar32 = auVar44._0_16_;
          if (auVar18 == (undefined1  [16])0x0) {
            auVar35 = vpcmpeqd_avx(auVar42._0_16_,(undefined1  [16])0x0);
            auVar32 = auVar32 ^ auVar35;
          }
          else {
            p_Var13 = context->args->filter;
            if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var13)(&local_168);
              auVar46 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
              auVar32 = vpcmpeqd_avx(auVar32,auVar32);
              auVar44 = ZEXT1664(auVar32);
              auVar42 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar39 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            auVar23._8_8_ = uStack_190;
            auVar23._0_8_ = local_198;
            auVar35 = vpcmpeqd_avx(auVar42._0_16_,auVar23);
            auVar32 = auVar44._0_16_ ^ auVar35;
            auVar35 = vblendvps_avx(auVar46._0_16_,*(undefined1 (*) [16])(local_168.ray + 0x80),
                                    auVar35);
            *(undefined1 (*) [16])(local_168.ray + 0x80) = auVar35;
          }
          auVar32 = vpslld_avx(auVar32,0x1f);
          bVar21 = (auVar32 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar22 = (auVar32 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar20 = (auVar32 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar19 = -1 < auVar32[0xf];
          bVar30 = ((bVar21 && bVar22) && bVar20) && bVar19;
          if (((bVar21 && bVar22) && bVar20) && bVar19) {
            *(undefined4 *)(ray + k * 4 + 0x80) = local_178._0_4_;
            uVar28 = uVar28 ^ 1L << (uVar25 & 0x3f);
          }
        }
      } while ((bVar30 != false) && (uVar28 != 0));
      return (bool)(bVar30 ^ 1);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom);
        const vbool<M> valid = Disc.valid();
        return DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0, n0,
            Occluded1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }